

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O1

KeyValue<supermap::Key<2UL>,_unsigned_int> __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>::
get(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_unsigned_int,_void>
    *this,uint index)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  istream *is;
  KeyValue<supermap::Key<2UL>,_unsigned_int> KVar3;
  long *local_70;
  string local_68;
  path local_48;
  
  peVar1 = (this->storageFile_).
           super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = (peVar1->manager_).
           super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (peVar1->manager_).
            super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,unsigned_int,void>::
  getStorageFilePath_abi_cxx11_
            (&local_68,
             (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2ul>,unsigned_int>,unsigned_int,void>
              *)this);
  std::filesystem::__cxx11::path::path(&local_48,&local_68,auto_format);
  (**peVar2->_vptr_FileManager)(&local_70,peVar2,&local_48,(ulong)index * 6);
  is = (istream *)(**(code **)*local_70)(local_70);
  KVar3 = io::DeserializeHelper<supermap::KeyValue<supermap::Key<2UL>,_unsigned_int>,_void>::
          deserialize(is);
  (**(code **)(*local_70 + 0x18))(local_70);
  std::filesystem::__cxx11::path::~path(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return KVar3;
}

Assistant:

[[nodiscard]] T get(IndexT index) const override {
        assert(index < getItemsCount());
        return getFileManager()->template getInputIterator<T, IndexT>(
            getStorageFilePath(),
            index * io::FixedDeserializedSizeRegister<T>::exactDeserializedSize
        ).next();
    }